

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O1

bool __thiscall
ON_OutlineFigure::IsInsideOf
          (ON_OutlineFigure *this,ON_OutlineFigure *outer_figure,bool bPerformExtraChecking)

{
  double dVar1;
  Orientation OVar2;
  bool bVar3;
  Orientation OVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ON_2dPoint *pOVar12;
  ulong uVar13;
  ulong uVar14;
  ON_2dPoint *pOVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar16;
  double dVar17;
  ON_2dPoint A [2];
  ON_SimpleArray<ON_2dPoint> outer_pline;
  ON_SimpleArray<ON_2dPoint> inner_pline;
  ON_2fPoint this_p [4];
  ON_BoundingBox outer_bbox;
  ON_BoundingBox this_bbox;
  ON_2dPoint local_1b8;
  ON_2dPoint local_1a8;
  double local_198;
  double local_190;
  double local_188;
  ON_SimpleArray<ON_2dPoint> local_180;
  undefined1 local_168 [16];
  ON_2dPoint *local_158;
  ON_2dPoint *local_150;
  ulong local_148;
  ON_2dPoint *local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  ON_SimpleArray<ON_2dPoint> local_100;
  ON_2dPoint local_e8;
  ON_2dPoint local_d8;
  double local_c8;
  undefined8 uStack_c0;
  ON_2fPoint local_b8 [5];
  ON_BoundingBox local_90;
  ON_BoundingBox local_60;
  
  if ((outer_figure != (ON_OutlineFigure *)0x0) &&
     (OVar2 = FigureOrientation(outer_figure), 0xfd < (byte)(OVar2 - NotOriented))) {
    BoundingBox(&local_60,this);
    BoundingBox(&local_90,outer_figure);
    bVar3 = ON_BoundingBox::Includes(&local_90,&local_60,false);
    if (!bVar3) {
      return false;
    }
    dVar16 = AreaEstimate(outer_figure);
    local_168._8_4_ = extraout_XMM0_Dc;
    local_168._0_8_ = dVar16;
    local_168._12_4_ = extraout_XMM0_Dd;
    dVar16 = AreaEstimate(this);
    if (dVar16 == 0.0) {
      return false;
    }
    if (ABS((double)local_168._0_8_) <= ABS(dVar16)) {
      return false;
    }
    uVar7 = GetUpToFourPointsOnFigure(this,local_b8);
    if (uVar7 != 0) {
      uVar13 = 0;
      do {
        iVar8 = WindingNumber(outer_figure,local_b8[uVar13]);
        iVar10 = -iVar8;
        if (OVar2 == CounterClockwise) {
          iVar10 = iVar8;
        }
        if (iVar10 != 1) {
          return false;
        }
        uVar13 = uVar13 + 1;
      } while (uVar7 != uVar13);
      OVar4 = FigureOrientation(this);
      if (OVar2 != OVar4 && !bPerformExtraChecking) {
        return true;
      }
      local_180._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081a0d8;
      local_180.m_a = (ON_2dPoint *)0x0;
      local_180.m_count = 0;
      local_180.m_capacity = 0;
      GetPolyline(outer_figure,0.0,&local_180);
      uVar13 = local_180._16_8_ & 0xffffffff;
      if (3 < uVar13) {
        local_100._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081a0d8;
        local_100.m_a = (ON_2dPoint *)0x0;
        local_100.m_count = 0;
        local_100.m_capacity = 0;
        GetPolyline(this,0.0,&local_100);
        uVar9 = local_100._16_8_ & 0xffffffff;
        if (1 < uVar9) {
          local_130 = (local_100.m_a)->x;
          local_110 = (local_100.m_a)->y;
          lVar11 = 0x10;
          dVar16 = local_110;
          local_118 = local_130;
          do {
            dVar17 = *(double *)((long)&(local_100.m_a)->x + lVar11);
            dVar1 = dVar17;
            if ((local_118 <= dVar17) && (dVar1 = local_118, local_130 < dVar17)) {
              local_130 = dVar17;
            }
            local_118 = dVar1;
            dVar17 = *(double *)((long)&(local_100.m_a)->y + lVar11);
            local_120 = dVar17;
            if ((dVar16 <= dVar17) && (local_120 = dVar16, local_110 < dVar17)) {
              local_110 = dVar17;
            }
            lVar11 = lVar11 + 0x10;
            dVar16 = local_120;
          } while (uVar9 << 4 != lVar11);
          local_1a8.x = (local_180.m_a)->x;
          local_1a8.y = (local_180.m_a)->y;
          local_e8.x = ON_2dPoint::NanPoint.x;
          local_e8.y = ON_2dPoint::NanPoint.y;
          local_d8.x = ON_2dPoint::NanPoint.x;
          local_d8.y = ON_2dPoint::NanPoint.y;
          uVar14 = 1;
          local_140 = local_100.m_a + 1;
          bVar3 = false;
          local_190 = ON_DBL_QNAN;
          local_138 = ON_DBL_QNAN;
          local_198 = ON_DBL_QNAN;
          local_150 = local_180.m_a;
          local_158 = local_100.m_a;
          pOVar12 = local_100.m_a;
          pOVar15 = local_180.m_a;
          local_148 = uVar13;
          do {
            local_1b8.x = local_1a8.x;
            local_1b8.y = local_1a8.y;
            local_1a8.x = pOVar15[uVar14].x;
            local_1a8.y = pOVar15[uVar14].y;
            bVar5 = ON_2dPoint::operator==(&local_1b8,&local_1a8);
            if (!bVar5) {
              dVar16 = local_1b8.x;
              if (local_1b8.x <= local_1a8.x) {
                dVar16 = local_1a8.x;
              }
              if ((local_118 <= dVar16) &&
                 (dVar17 = (double)(~-(ulong)(local_1a8.x < local_1b8.x) & (ulong)local_1b8.x |
                                   (ulong)local_1a8.x & -(ulong)(local_1a8.x < local_1b8.x)),
                 dVar17 <= local_130)) {
                local_128 = local_1b8.y;
                if (local_1b8.y <= local_1a8.y) {
                  local_128 = local_1a8.y;
                }
                if (local_120 <= local_128) {
                  local_c8 = (double)(~-(ulong)(local_1a8.y < local_1b8.y) & (ulong)local_1b8.y |
                                     (ulong)local_1a8.y & -(ulong)(local_1a8.y < local_1b8.y));
                  uStack_c0 = 0;
                  if (local_c8 <= local_110) {
                    local_168._8_8_ = 0;
                    local_168._0_8_ = dVar17;
                    local_d8.x = pOVar12->x;
                    local_d8.y = pOVar12->y;
                    bVar5 = true;
                    local_188 = local_138;
                    pOVar12 = local_140;
                    uVar13 = 2;
                    local_108 = dVar16;
                    do {
                      local_e8.x = local_d8.x;
                      local_e8.y = local_d8.y;
                      local_d8.x = pOVar12->x;
                      local_d8.y = pOVar12->y;
                      bVar6 = ON_2dPoint::operator==(&local_e8,&local_d8);
                      if ((((!bVar6) &&
                           (((double)local_168._0_8_ <= local_e8.x ||
                            ((double)local_168._0_8_ <= local_d8.x)))) &&
                          ((local_c8 <= local_e8.y || (local_c8 <= local_d8.y)))) &&
                         (((local_e8.x <= local_108 || (local_d8.x <= local_108)) &&
                          ((local_e8.y <= local_128 || (local_d8.y <= local_128)))))) {
                        if (NAN(local_188)) {
                          local_188 = local_1a8.y - local_1b8.y;
                          local_190 = local_1b8.x - local_1a8.x;
                          local_198 = local_1a8.x * local_1b8.y - local_1a8.y * local_1b8.x;
                        }
                        dVar16 = local_188 * local_e8.x + local_e8.y * local_190 + local_198;
                        dVar17 = local_188 * local_d8.x + local_d8.y * local_190 + local_198;
                        if (((0.0 <= dVar16) || (0.0 <= dVar17)) &&
                           ((dVar16 <= 0.0 || (dVar17 <= 0.0)))) {
                          dVar17 = local_d8.x * local_e8.y - local_d8.y * local_e8.x;
                          dVar16 = local_e8.x * (local_d8.y - local_e8.y) +
                                   local_e8.y * (local_e8.x - local_d8.x) + dVar17;
                          dVar17 = (local_d8.y - local_e8.y) * local_d8.x +
                                   (local_e8.x - local_d8.x) * local_d8.y + dVar17;
                          if (((0.0 <= dVar16) || (0.0 <= dVar17)) &&
                             ((dVar16 <= 0.0 || (dVar17 <= 0.0)))) break;
                        }
                      }
                      bVar5 = uVar13 < uVar9;
                      pOVar12 = pOVar12 + 1;
                      bVar6 = uVar13 != uVar9;
                      uVar13 = uVar13 + 1;
                    } while (bVar6);
                    pOVar12 = local_158;
                    uVar13 = local_148;
                    pOVar15 = local_150;
                    if (bVar5) break;
                  }
                }
              }
            }
            uVar14 = uVar14 + 1;
            bVar3 = uVar13 <= uVar14;
          } while (uVar14 != uVar13);
          ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&local_100);
          ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&local_180);
          if (bVar3) {
            return true;
          }
          return false;
        }
        ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&local_100);
      }
      ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&local_180);
    }
  }
  return false;
}

Assistant:

bool ON_OutlineFigure::IsInsideOf(
  const ON_OutlineFigure* outer_figure,
  bool bPerformExtraChecking
) const
{
  if (nullptr == outer_figure)
    return false;

  const ON_OutlineFigure::Orientation outer_orientation = outer_figure->FigureOrientation();
  if (ON_OutlineFigure::Orientation::Clockwise != outer_orientation && ON_OutlineFigure::Orientation::CounterClockwise != outer_orientation)
    return false;


  const ON_BoundingBox this_bbox = this->BoundingBox();
  const ON_BoundingBox outer_bbox = outer_figure->BoundingBox();
  if (false == outer_bbox.Includes(this_bbox))
  {
    // The bounding boxes are from the glyph outline control polygons.
    // There are rare case when this f is inside of other_f
    // but this_bbox is not contained in other_bbox. In practice, this
    // is quite rare, but that's why "probably" is part of this function's name.
    return false;
  }

  const double outer_area = fabs(outer_figure->AreaEstimate());
  const double this_area = fabs(this->AreaEstimate());
  if (false == (0.0 < this_area && this_area < outer_area))
    return false; // this figure is too big to be inside of other_f

  // Check that the 3 standard test points on this are inside of other_f.
  // Again, it is possible that the 3 test points are inside but some other
  // point is outside. In practice this is rare and that possibility
  // is why "probably" is in this function's name.

  const int outer_orientation_sign = ON_OutlineFigure::Orientation::CounterClockwise == outer_orientation ? 1 : -1;

  ON_2fPoint this_p[4];
  unsigned  this_point_count = this->GetUpToFourPointsOnFigure(this_p);

  for (unsigned i = 0; i < this_point_count; ++i)
  {
    // check start point.
    const int wn = outer_orientation_sign * outer_figure->WindingNumber(this_p[i]);
    if (1 != wn)
    {
      // this_p[i] is not inside of other_f.
      return false;
    }
  }

  if (0 == this_point_count)
    return false;

  const ON_OutlineFigure::Orientation this_orientation = this->FigureOrientation();

  if (outer_orientation == this_orientation || bPerformExtraChecking)
  {
    // The context that calls this function is sorting nested loops.
    // The orientation of outer_figure has been decided and set at this point.
    // When this orientation of this is not different, we need more checking
    // to verify that the orientation from the font definition file was really "wrong".
    // The "A crossbar" in Bahnschrift U+00C5 is one of many cases that
    // require this additional checking. More generally, glyphs with
    // orientations set correctly and which use overlapping outer 
    // boundaries need this test to prevent incorrectly. This situation is
    // common in fonts like Bahnschrift and fonts for Asian language scripts
    // that have "brush stroke" boundaries that overlap.
    if (false == Internal_ExtraInsideOfPolylineText(outer_figure, this))
      return false;
  }

  return true;
}